

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::ReadUInt(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  int local_44;
  IMkvReader *pIStack_40;
  int i;
  longlong result;
  uchar m;
  int status;
  uchar b;
  long *len_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if ((pReader == (IMkvReader *)0x0) || (pos < 0)) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    *len = 1;
    _status = len;
    len_local = (long *)pos;
    pos_local = (longlong)pReader;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,&m);
    if (iVar1 < 0) {
      pReader_local = (IMkvReader *)(long)iVar1;
    }
    else if (iVar1 < 1) {
      if (m == '\0') {
        pReader_local = (IMkvReader *)0xfffffffffffffffe;
      }
      else {
        for (result._7_1_ = 0x80; (m & result._7_1_) == 0;
            result._7_1_ = (byte)((int)(uint)result._7_1_ >> 1)) {
          *_status = *_status + 1;
        }
        pIStack_40 = (IMkvReader *)(long)(int)((uint)m & (result._7_1_ ^ 0xffffffff));
        for (local_44 = 1; len_local = (long *)((long)len_local + 1), (long)local_44 < *_status;
            local_44 = local_44 + 1) {
          iVar1 = (*(code *)**(undefined8 **)pos_local)(pos_local,len_local,1,&m);
          if (iVar1 < 0) {
            *_status = 1;
            return (long)iVar1;
          }
          if (0 < iVar1) {
            *_status = 1;
            return -3;
          }
          pIStack_40 = (IMkvReader *)((ulong)m | (long)pIStack_40 << 8);
        }
        pReader_local = pIStack_40;
      }
    }
    else {
      pReader_local = (IMkvReader *)0xfffffffffffffffd;
    }
  }
  return (longlong)pReader_local;
}

Assistant:

long long ReadUInt(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  len = 1;
  unsigned char b;
  int status = pReader->Read(pos, 1, &b);

  if (status < 0)  // error or underflow
    return status;

  if (status > 0)  // interpreted as "underflow"
    return E_BUFFER_NOT_FULL;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  long long result = b & (~m);
  ++pos;

  for (int i = 1; i < len; ++i) {
    status = pReader->Read(pos, 1, &b);

    if (status < 0) {
      len = 1;
      return status;
    }

    if (status > 0) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}